

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::NeuralNetworkLayer::InternalSwap
          (NeuralNetworkLayer *this,NeuralNetworkLayer *other)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  string *psVar4;
  LayerUnion LVar5;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->input_).super_RepeatedPtrFieldBase,&(other->input_).super_RepeatedPtrFieldBase)
  ;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->output_).super_RepeatedPtrFieldBase,
             &(other->output_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->inputtensor_).super_RepeatedPtrFieldBase,
             &(other->inputtensor_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->outputtensor_).super_RepeatedPtrFieldBase,
             &(other->outputtensor_).super_RepeatedPtrFieldBase);
  psVar4 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar4;
  bVar1 = this->isupdatable_;
  this->isupdatable_ = other->isupdatable_;
  other->isupdatable_ = bVar1;
  LVar5 = this->layer_;
  this->layer_ = other->layer_;
  other->layer_ = LVar5;
  uVar2 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar2;
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void NeuralNetworkLayer::InternalSwap(NeuralNetworkLayer* other) {
  input_.InternalSwap(&other->input_);
  output_.InternalSwap(&other->output_);
  inputtensor_.InternalSwap(&other->inputtensor_);
  outputtensor_.InternalSwap(&other->outputtensor_);
  name_.Swap(&other->name_);
  std::swap(isupdatable_, other->isupdatable_);
  std::swap(layer_, other->layer_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(_cached_size_, other->_cached_size_);
}